

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void md5_32(void *key,int len,uint32_t seed,void *out)

{
  uchar hash [16];
  md5_context ctx;
  undefined4 local_128 [4];
  md5_context local_118;
  
  md5_starts(&local_118);
  local_118.state[0] = local_118.state[0] ^ seed;
  md5_update(&local_118,(uchar *)key,len);
  md5_finish(&local_118,(uchar *)local_128);
  *(undefined4 *)out = local_128[0];
  return;
}

Assistant:

inline void md5_32(const void *key, int len, uint32_t seed, void *out) {
  unsigned char hash[16];
  md5_context ctx;
  md5_starts( &ctx );
  ctx.state[0] ^= seed;
  md5_update( &ctx, (unsigned char *)key, len );
  md5_finish( &ctx, hash );
  //memset( &ctx.buffer, 0, 64+64+64 ); // for buffer, ipad, opad
  memcpy(out, hash, 4);
}